

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations::Print
          (ForwardDeclarations *this,Formatter *format,Options *options)

{
  _Base_ptr p_Var1;
  Options *in_RCX;
  string *enumname;
  _Rb_tree_header *p_Var2;
  Descriptor *class_desc;
  EnumDescriptor *enum_desc;
  cpp *local_80;
  ForwardDeclarations *local_78;
  undefined1 local_70 [32];
  string local_50;
  
  p_Var1 = (this->enums_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->enums_)._M_t._M_impl.super__Rb_tree_header;
  local_78 = this;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      in_RCX = (Options *)(p_Var1 + 1);
      local_70._0_8_ = *(undefined8 *)(p_Var1 + 2);
      Formatter::operator()
                (format,"enum ${1$$2$$}$ : int;\nbool $2$_IsValid(int value);\n",
                 (EnumDescriptor **)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  p_Var1 = (local_78->classes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(local_78->classes_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_80 = *(cpp **)(p_Var1 + 2);
      DefaultInstanceType_abi_cxx11_((string *)local_70,local_80,(Descriptor *)options,in_RCX);
      DefaultInstanceName_abi_cxx11_(&local_50,local_80,(Descriptor *)options,in_RCX);
      in_RCX = (Options *)(p_Var1 + 1);
      Formatter::operator()
                (format,"class ${1$$2$$}$;\nstruct $3$;\n$dllexport_decl $extern $3$ $4$;\n",
                 (Descriptor **)&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX,
                 (string *)local_70,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((EnumDescriptor *)local_70._0_8_ != (EnumDescriptor *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_);
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return;
}

Assistant:

void Print(const Formatter& format, const Options& options) const {
    for (const auto& p : enums_) {
      const std::string& enumname = p.first;
      const EnumDescriptor* enum_desc = p.second;
      format(
          "enum ${1$$2$$}$ : int;\n"
          "bool $2$_IsValid(int value);\n",
          enum_desc, enumname);
    }
    for (const auto& p : classes_) {
      const std::string& classname = p.first;
      const Descriptor* class_desc = p.second;
      format(
          "class ${1$$2$$}$;\n"
          "struct $3$;\n"
          "$dllexport_decl $extern $3$ $4$;\n",
          class_desc, classname, DefaultInstanceType(class_desc, options),
          DefaultInstanceName(class_desc, options));
    }
  }